

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rcamera.h
# Opt level: O1

Vector3 GetCameraUp(Camera *camera)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  Vector3 VVar5;
  
  fVar1 = (camera->up).x;
  fVar2 = (camera->up).y;
  fVar4 = (camera->up).z;
  fVar3 = fVar4 * fVar4 + fVar1 * fVar1 + fVar2 * fVar2;
  if (fVar3 < 0.0) {
    fVar3 = sqrtf(fVar3);
  }
  else {
    fVar3 = SQRT(fVar3);
  }
  if ((fVar3 != 0.0) || (NAN(fVar3))) {
    fVar3 = 1.0 / fVar3;
    fVar1 = fVar1 * fVar3;
    fVar2 = fVar2 * fVar3;
    fVar4 = fVar4 * fVar3;
  }
  VVar5.y = fVar2;
  VVar5.x = fVar1;
  VVar5.z = fVar4;
  return VVar5;
}

Assistant:

Vector3 GetCameraUp(Camera *camera)
{
    return Vector3Normalize(camera->up);
}